

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
Parser::extractBracketArguments
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Parser *this,string *data)

{
  char cVar1;
  pointer pbVar2;
  bool bVar3;
  ulong uVar4;
  string *psVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ulong uVar6;
  bool bVar7;
  int iVar8;
  pointer pbVar9;
  string argumentBuffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  if (*(data->_M_dataplus)._M_p == '(') {
    std::__cxx11::string::erase((ulong)data,0);
  }
  if ((data->_M_dataplus)._M_p[data->_M_string_length - 1] == ')') {
    std::__cxx11::string::erase((ulong)data,data->_M_string_length - 1);
  }
  if (data->_M_string_length != 0) {
    bVar7 = false;
    iVar8 = 0;
    uVar4 = 0;
    uVar6 = 1;
    do {
      cVar1 = (data->_M_dataplus)._M_p[uVar4];
      bVar7 = (bool)(cVar1 == '\"' ^ bVar7);
      if (cVar1 == '(') {
        if (!bVar7) {
          iVar8 = iVar8 + 1;
        }
      }
      else if (cVar1 == ')') {
        iVar8 = iVar8 - (uint)(byte)~bVar7;
      }
      if (iVar8 < 0) {
        psVar5 = (string *)__cxa_allocate_exception(0x20);
        *(string **)psVar5 = psVar5 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>(psVar5,"Bracket mismatch","");
        __cxa_throw(psVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      if ((((cVar1 == ',') && (local_50._M_string_length != 0)) && (iVar8 == 0)) && (bVar7 == false)
         ) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_50);
        local_50._M_string_length = 0;
        *local_50._M_dataplus._M_p = '\0';
      }
      else {
        std::__cxx11::string::push_back((char)&local_50);
      }
      bVar3 = uVar6 < data->_M_string_length;
      uVar4 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar3);
  }
  if (local_50._M_string_length != 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_50);
  }
  pbVar2 = (__return_storage_ptr__->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar9 = (__return_storage_ptr__->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar2; pbVar9 = pbVar9 + 1) {
    while (*(pbVar9->_M_dataplus)._M_p == ' ') {
      std::__cxx11::string::erase((ulong)pbVar9,0);
    }
    while ((pbVar9->_M_dataplus)._M_p[pbVar9->_M_string_length - 1] == ' ') {
      std::__cxx11::string::erase((ulong)pbVar9,pbVar9->_M_string_length - 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> Parser::extractBracketArguments(std::string data)
{
    std::vector<std::string> arguments;
    std::string argumentBuffer;
    bool isQuoteOpen = false;
    int bracketDepth = 0;

    //Take off surrounding brackets if any as these aren't needed in the split results
    if(data[0] == '(')
        data.erase(0,1);
    if(data[data.size()-1] == ')')
        data.erase(data.size()-1, 1);

    //Go through each character and split each argument into a separate vector element
    for(unsigned int c = 0; c < data.size(); c++) //Ignore opening and close brackets
    {
        if(data[c] == '"')
            isQuoteOpen = !isQuoteOpen;
        if(data[c] == '(' && !isQuoteOpen)
            bracketDepth++;
        else if(data[c] == ')' && !isQuoteOpen)
            bracketDepth--;
        if(bracketDepth < 0)
            throw std::string("Bracket mismatch");
        if(data[c] == ',' && !argumentBuffer.empty() && !isQuoteOpen && bracketDepth == 0)
        {
            arguments.emplace_back(argumentBuffer);
            argumentBuffer.clear();
        }
        else
        {
            argumentBuffer += data[c];
        }
    }
    if(!argumentBuffer.empty())
        arguments.emplace_back(argumentBuffer);

    //Fix the spacing
    for(auto &arg : arguments)
    {
        while(arg[0] == ' ')
            arg.erase(0,1);
        while(arg[arg.size()-1] == ' ')
            arg.erase(arg.size()-1, 1);
    }

    return arguments;
}